

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_vmevent.c
# Opt level: O0

ptrdiff_t lj_vmevent_prepare(lua_State *L,VMEvent ev)

{
  uint64_t uVar1;
  TValue *pTVar2;
  VMEvent key;
  GCstr *key_00;
  cTValue *pcVar3;
  cTValue *local_c0;
  int hash;
  cTValue *tv;
  GCstr *s;
  global_State *g;
  VMEvent ev_local;
  lua_State *L_local;
  
  uVar1 = (L->glref).ptr64;
  key_00 = lj_str_new(L,"_VMEVENTS",9);
  pcVar3 = lj_tab_getstr((GCtab *)(*(ulong *)((L->glref).ptr64 + 0x110) & 0x7fffffffffff),key_00);
  if ((int)(pcVar3->field_4).it >> 0xf == -0xc) {
    key = ev & 0xfffffff8;
    if ((uint)key < (uint)*(VMEvent *)((pcVar3->u64 & 0x7fffffffffff) + 0x30)) {
      local_c0 = (cTValue *)(*(long *)((pcVar3->u64 & 0x7fffffffffff) + 0x10) + (long)key * 8);
    }
    else {
      local_c0 = lj_tab_getinth((GCtab *)(pcVar3->u64 & 0x7fffffffffff),key);
    }
    if ((local_c0 != (cTValue *)0x0) && ((int)(local_c0->field_4).it >> 0xf == -9)) {
      if ((long)((L->maxstack).ptr64 - (long)L->top) < 0xa1) {
        lj_state_growstack(L,0x14);
      }
      pTVar2 = L->top;
      L->top = pTVar2 + 1;
      pTVar2->u64 = local_c0->u64 & 0x7fffffffffff | 0xfffb800000000000;
      pTVar2 = L->top;
      L->top = pTVar2 + 1;
      pTVar2->u64 = 0xffffffffffffffff;
      return (long)L->top - (L->stack).ptr64;
    }
  }
  *(byte *)(uVar1 + 0x93) = *(byte *)(uVar1 + 0x93) & ((byte)(1 << ((byte)ev & 7)) ^ 0xff);
  return 0;
}

Assistant:

ptrdiff_t lj_vmevent_prepare(lua_State *L, VMEvent ev)
{
  global_State *g = G(L);
  GCstr *s = lj_str_newlit(L, LJ_VMEVENTS_REGKEY);
  cTValue *tv = lj_tab_getstr(tabV(registry(L)), s);
  if (tvistab(tv)) {
    int hash = VMEVENT_HASH(ev);
    tv = lj_tab_getint(tabV(tv), hash);
    if (tv && tvisfunc(tv)) {
      lj_state_checkstack(L, LUA_MINSTACK);
      setfuncV(L, L->top++, funcV(tv));
      if (LJ_FR2) setnilV(L->top++);
      return savestack(L, L->top);
    }
  }
  g->vmevmask &= ~VMEVENT_MASK(ev);  /* No handler: cache this fact. */
  return 0;
}